

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.cpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanCommandBuffer::TransitionImageLayout
          (VulkanCommandBuffer *this,VkImage Image,VkImageLayout OldLayout,VkImageLayout NewLayout,
          VkImageSubresourceRange *SubresRange,VkPipelineStageFlags SrcStages,
          VkPipelineStageFlags DstStages)

{
  uint Max0;
  uint Max1;
  VkPipelineStageFlags *pVVar1;
  VkAccessFlags *pVVar2;
  uint Min1;
  int iVar3;
  uint Min0;
  uint Min1_00;
  pointer pVVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  VkAccessFlags VVar8;
  uint Max1_00;
  undefined4 in_register_0000000c;
  char (*Args_1) [49];
  long lVar9;
  size_t i;
  ulong uVar10;
  string msg;
  
  Args_1 = (char (*) [49])CONCAT44(in_register_0000000c,NewLayout);
  EndRenderScope(this);
  uVar7 = (this->m_Barrier).SupportedStagesMask;
  if ((uVar7 & SrcStages) == 0) {
    Diligent::FormatString<char[26],char[49]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(SrcStages & m_Barrier.SupportedStagesMask) != 0",Args_1);
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"TransitionImageLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBuffer.cpp"
               ,0xa2);
    std::__cxx11::string::~string((string *)&msg);
    uVar7 = (this->m_Barrier).SupportedStagesMask;
  }
  if ((uVar7 & DstStages) == 0) {
    Diligent::FormatString<char[26],char[49]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(DstStages & m_Barrier.SupportedStagesMask) != 0",
               (char (*) [49])(ulong)DstStages);
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"TransitionImageLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBuffer.cpp"
               ,0xa3);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (OldLayout == NewLayout) {
    (this->m_Barrier).MemorySrcStages = (this->m_Barrier).MemorySrcStages | SrcStages;
    pVVar1 = &(this->m_Barrier).MemoryDstStages;
    *pVVar1 = *pVVar1 | DstStages;
    VVar8 = anon_unknown_1::AccessMaskFromImageLayout(OldLayout,false);
    pVVar2 = &(this->m_Barrier).MemorySrcAccess;
    *pVVar2 = *pVVar2 | VVar8;
    VVar8 = anon_unknown_1::AccessMaskFromImageLayout(OldLayout,true);
    pVVar2 = &(this->m_Barrier).MemoryDstAccess;
    *pVVar2 = *pVVar2 | VVar8;
  }
  else {
    lVar9 = 0x40;
    for (uVar10 = 0;
        pVVar4 = (this->m_ImageBarriers).
                 super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        uVar10 < (ulong)(((long)(this->m_ImageBarriers).
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4) / 0x48);
        uVar10 = uVar10 + 1) {
      if (*(VkImage *)((long)pVVar4 + lVar9 + -0x18) == Image) {
        uVar7 = SubresRange->layerCount + SubresRange->baseArrayLayer;
        if (SubresRange->layerCount == 0xffffffff) {
          uVar7 = 0xffffffff;
        }
        Min1 = *(uint *)((long)pVVar4 + lVar9 + -4);
        iVar3 = *(int *)((long)&pVVar4->sType + lVar9);
        Max1_00 = iVar3 + Min1;
        if (iVar3 == -1) {
          Max1_00 = 0xffffffff;
        }
        Min0 = SubresRange->baseMipLevel;
        Max0 = SubresRange->levelCount + Min0;
        if (SubresRange->levelCount == 0xffffffff) {
          Max0 = 0xffffffff;
        }
        Min1_00 = *(uint *)((long)pVVar4 + lVar9 + -0xc);
        iVar3 = *(int *)((long)pVVar4 + lVar9 + -8);
        Max1 = iVar3 + Min1_00;
        if (iVar3 == -1) {
          Max1 = 0xffffffff;
        }
        bVar5 = Diligent::CheckLineSectionOverlap<true,unsigned_int>
                          (SubresRange->baseArrayLayer,uVar7,Min1,Max1_00);
        bVar6 = Diligent::CheckLineSectionOverlap<true,unsigned_int>(Min0,Max0,Min1_00,Max1);
        if ((bVar5) && (bVar6)) {
          FlushBarriers(this);
          break;
        }
      }
      lVar9 = lVar9 + 0x48;
    }
    pVVar1 = &(this->m_Barrier).ImageSrcStages;
    *pVVar1 = *pVVar1 | SrcStages;
    pVVar1 = &(this->m_Barrier).ImageDstStages;
    *pVVar1 = *pVVar1 | DstStages;
    msg._M_string_length = 0;
    msg.field_2._M_allocated_capacity = 0;
    msg._M_dataplus._M_p = (pointer)0x2d;
    msg.field_2._12_4_ = NewLayout;
    msg.field_2._8_4_ = OldLayout;
    VVar8 = anon_unknown_1::AccessMaskFromImageLayout(OldLayout,false);
    msg.field_2._M_allocated_capacity._0_4_ = VVar8 & (this->m_Barrier).SupportedAccessMask;
    VVar8 = anon_unknown_1::AccessMaskFromImageLayout(NewLayout,true);
    msg.field_2._M_allocated_capacity._4_4_ = VVar8 & (this->m_Barrier).SupportedAccessMask;
    std::vector<VkImageMemoryBarrier,std::allocator<VkImageMemoryBarrier>>::
    emplace_back<VkImageMemoryBarrier&>
              ((vector<VkImageMemoryBarrier,std::allocator<VkImageMemoryBarrier>> *)
               &this->m_ImageBarriers,(VkImageMemoryBarrier *)&msg);
  }
  return;
}

Assistant:

void VulkanCommandBuffer::TransitionImageLayout(VkImage                        Image,
                                                VkImageLayout                  OldLayout,
                                                VkImageLayout                  NewLayout,
                                                const VkImageSubresourceRange& SubresRange,
                                                VkPipelineStageFlags           SrcStages,
                                                VkPipelineStageFlags           DstStages)
{
    // Image layout transitions within a render pass execute
    // dependencies between attachments
    EndRenderScope();

    VERIFY_EXPR((SrcStages & m_Barrier.SupportedStagesMask) != 0);
    VERIFY_EXPR((DstStages & m_Barrier.SupportedStagesMask) != 0);

    if (OldLayout == NewLayout)
    {
        m_Barrier.MemorySrcStages |= SrcStages;
        m_Barrier.MemoryDstStages |= DstStages;

        m_Barrier.MemorySrcAccess |= AccessMaskFromImageLayout(OldLayout, false);
        m_Barrier.MemoryDstAccess |= AccessMaskFromImageLayout(NewLayout, true);
        return;
    }

    // Check overlapping subresources
    for (size_t i = 0; i < m_ImageBarriers.size(); ++i)
    {
        const auto& ImgBarrier = m_ImageBarriers[i];
        if (ImgBarrier.image != Image)
            continue;

        const auto& OtherRange = ImgBarrier.subresourceRange;

        const auto StartLayer0 = SubresRange.baseArrayLayer;
        const auto EndLayer0   = SubresRange.layerCount != VK_REMAINING_ARRAY_LAYERS ? (SubresRange.baseArrayLayer + SubresRange.layerCount) : ~0u;
        const auto StartLayer1 = OtherRange.baseArrayLayer;
        const auto EndLayer1   = OtherRange.layerCount != VK_REMAINING_ARRAY_LAYERS ? (OtherRange.baseArrayLayer + OtherRange.layerCount) : ~0u;

        const auto StartMip0 = SubresRange.baseMipLevel;
        const auto EndMip0   = SubresRange.levelCount != VK_REMAINING_MIP_LEVELS ? (SubresRange.baseMipLevel + SubresRange.levelCount) : ~0u;
        const auto StartMip1 = OtherRange.baseMipLevel;
        const auto EndMip1   = OtherRange.levelCount != VK_REMAINING_MIP_LEVELS ? (OtherRange.baseMipLevel + OtherRange.levelCount) : ~0u;

        const auto SlicesOverlap = Diligent::CheckLineSectionOverlap<true>(StartLayer0, EndLayer0, StartLayer1, EndLayer1);
        const auto MipsOverlap   = Diligent::CheckLineSectionOverlap<true>(StartMip0, EndMip0, StartMip1, EndMip1);

        // If the range overlaps with any of the existing barriers, we need to
        // flush them.
        if (SlicesOverlap && MipsOverlap)
        {
            FlushBarriers();
            break;
        }
    }

    m_Barrier.ImageSrcStages |= SrcStages;
    m_Barrier.ImageDstStages |= DstStages;

    VkImageMemoryBarrier ImgBarrier{};
    ImgBarrier.sType               = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    ImgBarrier.pNext               = nullptr;
    ImgBarrier.oldLayout           = OldLayout;
    ImgBarrier.newLayout           = NewLayout;
    ImgBarrier.image               = Image;
    ImgBarrier.subresourceRange    = SubresRange;
    ImgBarrier.srcAccessMask       = AccessMaskFromImageLayout(OldLayout, false) & m_Barrier.SupportedAccessMask;
    ImgBarrier.dstAccessMask       = AccessMaskFromImageLayout(NewLayout, true) & m_Barrier.SupportedAccessMask;
    ImgBarrier.srcQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED; // source queue family for a queue family ownership transfer.
    ImgBarrier.dstQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED; // destination queue family for a queue family ownership transfer.
    m_ImageBarriers.emplace_back(ImgBarrier);
}